

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void print_resources(Compiler *compiler,StorageClass storage,
                    SmallVector<spirv_cross::BuiltInResource,_8UL> *resources)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BuiltIn BVar3;
  size_t sVar4;
  bool bVar5;
  BuiltIn __val;
  Compiler *this;
  char cVar6;
  bool bVar7;
  uint uVar8;
  SPIRType *pSVar9;
  size_t sVar10;
  undefined8 *puVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  BuiltInResource *pBVar16;
  char cVar17;
  char *in_R8;
  char cVar18;
  uint32_t array_size;
  string builtin_str;
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  string type_str;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  BuiltInResource *local_40;
  Compiler *local_38;
  
  pcVar15 = "builtin outputs";
  if (storage == StorageClassInput) {
    pcVar15 = "builtin inputs";
  }
  local_38 = compiler;
  fprintf(_stderr,"%s\n",pcVar15);
  fwrite("=============\n\n",0xf,1,_stderr);
  sVar4 = (resources->super_VectorView<spirv_cross::BuiltInResource>).buffer_size;
  if (sVar4 != 0) {
    pBVar16 = (resources->super_VectorView<spirv_cross::BuiltInResource>).ptr;
    local_40 = pBVar16 + sVar4;
    do {
      this = local_38;
      bVar7 = spirv_cross::Compiler::has_active_builtin(local_38,pBVar16->builtin,storage);
      pSVar9 = spirv_cross::Compiler::get_type(this,(TypeID)(pBVar16->value_type_id).id);
      uVar8 = pSVar9->basetype - Int;
      pcVar15 = "?";
      if (uVar8 < 7) {
        pcVar15 = &DAT_002a7cbc + *(int *)(&DAT_002a7cbc + (ulong)uVar8 * 4);
      }
      array_size = 0;
      if ((pSVar9->array).super_VectorView<unsigned_int>.buffer_size == 0) {
        cVar18 = '\0';
      }
      else {
        array_size = *(pSVar9->array).super_VectorView<unsigned_int>.ptr;
        cVar18 = *(pSVar9->array_size_literal).super_VectorView<bool>.ptr;
      }
      type_str._M_dataplus._M_p = (pointer)&type_str.field_2;
      sVar10 = strlen(pcVar15);
      std::__cxx11::string::_M_construct<char_const*>((string *)&type_str,pcVar15,pcVar15 + sVar10);
      uVar8 = pSVar9->vecsize;
      paVar2 = &builtin_str.field_2;
      if (1 < uVar8) {
        cVar17 = '\x01';
        if (9 < uVar8) {
          uVar12 = uVar8;
          cVar6 = '\x04';
          do {
            cVar17 = cVar6;
            if (uVar12 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_0010c0dc;
            }
            if (uVar12 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_0010c0dc;
            }
            if (uVar12 < 10000) goto LAB_0010c0dc;
            bVar5 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar6 = cVar17 + '\x04';
          } while (bVar5);
          cVar17 = cVar17 + '\x01';
        }
LAB_0010c0dc:
        builtin_str._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct((ulong)&builtin_str,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (builtin_str._M_dataplus._M_p,(uint)builtin_str._M_string_length,uVar8);
        std::__cxx11::string::_M_append((char *)&type_str,(ulong)builtin_str._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)builtin_str._M_dataplus._M_p != paVar2) {
          operator_delete(builtin_str._M_dataplus._M_p);
        }
      }
      if (array_size != 0) {
        if (cVar18 == '\0') {
          spirv_cross::join<char_const(&)[2],unsigned_int&,char_const(&)[21]>
                    (&builtin_str,(spirv_cross *)0x2be9ba,(char (*) [2])&array_size,
                     (uint *)" (spec constant ID)]",(char (*) [21])in_R8);
          std::__cxx11::string::_M_append((char *)&type_str,(ulong)builtin_str._M_dataplus._M_p);
        }
        else {
          spirv_cross::join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    (&builtin_str,(spirv_cross *)0x2be9ba,(char (*) [2])&array_size,(uint *)0x2be8bf
                     ,(char (*) [2])in_R8);
          std::__cxx11::string::_M_append((char *)&type_str,(ulong)builtin_str._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)builtin_str._M_dataplus._M_p != paVar2) {
          operator_delete(builtin_str._M_dataplus._M_p);
        }
      }
      builtin_str._M_string_length = 0;
      builtin_str.field_2._M_local_buf[0] = '\0';
      BVar3 = pBVar16->builtin;
      if (((ulong)BVar3 < 0xd) && ((0x181bU >> (BVar3 & BuiltInGlobalSize) & 1) != 0)) {
        builtin_str._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_replace
                  ((ulong)&builtin_str,0,(char *)0x0,
                   (ulong)(&DAT_002a7cd8 + *(int *)(&DAT_002a7cd8 + (ulong)BVar3 * 4)));
      }
      else {
        builtin_str._M_dataplus._M_p = (pointer)paVar2;
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"builtin #","");
        BVar3 = pBVar16->builtin;
        __val = -BVar3;
        if (0 < (int)BVar3) {
          __val = BVar3;
        }
        uVar8 = 1;
        if (BuiltInLayer < __val) {
          uVar14 = (ulong)__val;
          uVar12 = 4;
          do {
            uVar8 = uVar12;
            uVar13 = (uint)uVar14;
            if (uVar13 < 100) {
              uVar8 = uVar8 - 2;
              goto LAB_0010c274;
            }
            if (uVar13 < 1000) {
              uVar8 = uVar8 - 1;
              goto LAB_0010c274;
            }
            if (uVar13 < 10000) goto LAB_0010c274;
            uVar14 = uVar14 / 10000;
            uVar12 = uVar8 + 4;
          } while (99999 < uVar13);
          uVar8 = uVar8 + 1;
        }
LAB_0010c274:
        local_c0 = local_b0;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_c0,(char)uVar8 - (char)((int)BVar3 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(BVar3 >> 0x1f) + (long)local_c0),uVar8,__val);
        uVar14 = 0xf;
        if (local_60 != local_50) {
          uVar14 = local_50[0];
        }
        if (uVar14 < (ulong)(local_b8 + local_58)) {
          uVar14 = 0xf;
          if (local_c0 != local_b0) {
            uVar14 = local_b0[0];
          }
          if (uVar14 < (ulong)(local_b8 + local_58)) goto LAB_0010c2fa;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_60);
        }
        else {
LAB_0010c2fa:
          puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_c0)
          ;
        }
        local_a0 = (undefined8 *)*puVar11;
        puVar1 = puVar11 + 2;
        if (local_a0 == puVar1) {
          local_90 = *puVar1;
          uStack_88 = puVar11[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *puVar1;
        }
        local_98 = puVar11[1];
        *puVar11 = puVar1;
        puVar11[1] = 0;
        *(undefined1 *)puVar1 = 0;
        std::__cxx11::string::operator=((string *)&builtin_str,(string *)&local_a0);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if (local_c0 != local_b0) {
          operator_delete(local_c0);
        }
        if (local_60 != local_50) {
          operator_delete(local_60);
        }
      }
      in_R8 = "no";
      if (bVar7) {
        in_R8 = "yes";
      }
      fprintf(_stderr,"Builtin %s (%s) (active: %s).\n",builtin_str._M_dataplus._M_p,
              type_str._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)builtin_str._M_dataplus._M_p != &builtin_str.field_2) {
        operator_delete(builtin_str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)type_str._M_dataplus._M_p != &type_str.field_2) {
        operator_delete(type_str._M_dataplus._M_p);
      }
      pBVar16 = pBVar16 + 1;
    } while (pBVar16 != local_40);
  }
  fwrite("=============\n\n",0xf,1,_stderr);
  return;
}

Assistant:

static void print_resources(const Compiler &compiler, spv::StorageClass storage,
                            const SmallVector<BuiltInResource> &resources)
{
	fprintf(stderr, "%s\n", storage == StorageClassInput ? "builtin inputs" : "builtin outputs");
	fprintf(stderr, "=============\n\n");
	for (auto &res : resources)
	{
		bool active = compiler.has_active_builtin(res.builtin, storage);
		const char *basetype = "?";
		auto &type = compiler.get_type(res.value_type_id);
		switch (type.basetype)
		{
		case SPIRType::Float: basetype = "float"; break;
		case SPIRType::Int: basetype = "int"; break;
		case SPIRType::UInt: basetype = "uint"; break;
		default: break;
		}

		uint32_t array_size = 0;
		bool array_size_literal = false;
		if (!type.array.empty())
		{
			array_size = type.array.front();
			array_size_literal = type.array_size_literal.front();
		}

		string type_str = basetype;
		if (type.vecsize > 1)
			type_str += std::to_string(type.vecsize);

		if (array_size)
		{
			if (array_size_literal)
				type_str += join("[", array_size, "]");
			else
				type_str += join("[", array_size, " (spec constant ID)]");
		}

		string builtin_str;
		switch (res.builtin)
		{
		case spv::BuiltInPosition: builtin_str = "Position"; break;
		case spv::BuiltInPointSize: builtin_str = "PointSize"; break;
		case spv::BuiltInCullDistance: builtin_str = "CullDistance"; break;
		case spv::BuiltInClipDistance: builtin_str = "ClipDistance"; break;
		case spv::BuiltInTessLevelInner: builtin_str = "TessLevelInner"; break;
		case spv::BuiltInTessLevelOuter: builtin_str = "TessLevelOuter"; break;
		default: builtin_str = string("builtin #") + to_string(res.builtin);
		}

		fprintf(stderr, "Builtin %s (%s) (active: %s).\n", builtin_str.c_str(), type_str.c_str(), active ? "yes" : "no");
	}
	fprintf(stderr, "=============\n\n");
}